

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  int iVar1;
  ImRect *pIVar2;
  int iVar3;
  int iVar4;
  ImGuiTabBar *pIVar5;
  ImGuiTabBar *pIVar6;
  int iVar7;
  
  iVar3 = this->FreeIdx;
  iVar7 = (this->Data).Size;
  if (iVar3 == iVar7) {
    iVar1 = iVar7 + 1;
    iVar4 = (this->Data).Capacity;
    if (iVar4 <= iVar7) {
      if (iVar4 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar4 / 2 + iVar4;
      }
      if (iVar7 <= iVar1) {
        iVar7 = iVar1;
      }
      if (iVar4 < iVar7) {
        pIVar6 = (ImGuiTabBar *)ImGui::MemAlloc((long)iVar7 * 0x60);
        pIVar5 = (this->Data).Data;
        if (pIVar5 != (ImGuiTabBar *)0x0) {
          memcpy(pIVar6,pIVar5,(long)(this->Data).Size * 0x60);
          ImGui::MemFree((this->Data).Data);
        }
        (this->Data).Data = pIVar6;
        (this->Data).Capacity = iVar7;
      }
    }
    (this->Data).Size = iVar1;
    iVar7 = this->FreeIdx + 1;
  }
  else {
    iVar7 = (this->Data).Data[iVar3].Tabs.Size;
  }
  this->FreeIdx = iVar7;
  pIVar6 = (this->Data).Data;
  pIVar5 = pIVar6 + iVar3;
  (pIVar5->Tabs).Size = 0;
  (pIVar5->Tabs).Capacity = 0;
  (pIVar5->Tabs).Data = (ImGuiTabItem *)0x0;
  pIVar2 = &pIVar6[iVar3].BarRect;
  (pIVar2->Min).x = 3.4028235e+38;
  (pIVar2->Min).y = 3.4028235e+38;
  (pIVar2->Max).x = -3.4028235e+38;
  (pIVar2->Max).y = -3.4028235e+38;
  pIVar5 = pIVar6 + iVar3;
  pIVar5->ID = 0;
  pIVar5->SelectedTabId = 0;
  *(undefined8 *)(&pIVar5->ID + 2) = 0;
  pIVar6[iVar3].CurrFrameVisible = -1;
  pIVar6[iVar3].PrevFrameVisible = -1;
  pIVar5 = pIVar6 + iVar3;
  pIVar5->ContentsHeight = 0.0;
  pIVar5->OffsetMax = 0.0;
  *(undefined8 *)(&pIVar5->ContentsHeight + 2) = 0;
  pIVar5 = pIVar6 + iVar3;
  pIVar5->ScrollingTarget = 0.0;
  pIVar5->Flags = 0;
  *(undefined8 *)(&pIVar5->ScrollingTarget + 2) = 0;
  pIVar6 = pIVar6 + iVar3;
  pIVar6->WantLayout = false;
  pIVar6->VisibleTabWasSubmitted = false;
  pIVar6->LastTabItemIdx = -1;
  return (this->Data).Data + iVar3;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Data.Size) { Data.resize(Data.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Data[idx]; } IM_PLACEMENT_NEW(&Data[idx]) T(); return &Data[idx]; }